

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O0

stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
* __thiscall
fp::Algorithm::BackTrack
          (stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
           *__return_storage_ptr__,Algorithm *this,array<int,_2UL> current_node,
          array<std::array<fp::Node,_16UL>,_16UL> *node)

{
  array<int,_2UL> this_00;
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  array<int,_2UL> local_30;
  array<int,_2UL> parent_node;
  array<std::array<fp::Node,_16UL>,_16UL> *node_local;
  Algorithm *this_local;
  array<int,_2UL> current_node_local;
  
  parent_node._M_elems = (_Type)node;
  this_local = (Algorithm *)current_node._M_elems;
  current_node_local._M_elems = (_Type)__return_storage_ptr__;
  pvVar2 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,0);
  pvVar3 = std::array<std::array<fp::Node,_16UL>,_16UL>::operator[](node,(long)*pvVar2);
  pvVar2 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,1);
  pvVar4 = std::array<fp::Node,_16UL>::operator[](pvVar3,(long)*pvVar2);
  local_30._M_elems = *&(pvVar4->parent_node_)._M_elems;
  std::
  stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
  ::push(&this->path_stack_,(value_type *)&this_local);
  while( true ) {
    bVar1 = std::operator==((array<int,_2UL> *)&this_local,&local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    Maze::ColorPath((array<int,_2UL>)this_local);
    this_00 = parent_node;
    this_local = (Algorithm *)local_30._M_elems;
    pvVar2 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,0);
    pvVar3 = std::array<std::array<fp::Node,_16UL>,_16UL>::operator[]
                       ((array<std::array<fp::Node,_16UL>,_16UL> *)this_00._M_elems,(long)*pvVar2);
    pvVar2 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,1);
    pvVar4 = std::array<fp::Node,_16UL>::operator[](pvVar3,(long)*pvVar2);
    local_30._M_elems = *&(pvVar4->parent_node_)._M_elems;
    std::
    stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
    ::push(&this->path_stack_,(value_type *)&this_local);
  }
  std::
  stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
  ::stack(__return_storage_ptr__,&this->path_stack_);
  return __return_storage_ptr__;
}

Assistant:

std::stack<std::array<int, 2>>
fp::Algorithm::BackTrack(std::array<int, 2> current_node, std::array<std::array<Node, 16>, 16> &node) {
    std::array<int, 2> parent_node = node[current_node[0]][current_node[1]].parent_node_;
    this->path_stack_.push(current_node);
    while (!(current_node == parent_node)) {
        fp::Maze::ColorPath(current_node);
        current_node = parent_node;
        parent_node = node[current_node[0]][current_node[1]].parent_node_;
        this->path_stack_.push(current_node);
    }
    return this->path_stack_;
}